

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

counting_iterator __thiscall
duckdb_fmt::v6::internal::float_writer<wchar_t>::
prettify<duckdb_fmt::v6::internal::counting_iterator>
          (float_writer<wchar_t> *this,counting_iterator it)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int num_zeros;
  counting_iterator cVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int i;
  int iVar11;
  long lVar12;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  byte bVar16;
  int i_1;
  int iVar17;
  ulong uVar18;
  int iVar19;
  
  uVar8 = this->num_digits_;
  uVar7 = this->exp_;
  uVar18 = (ulong)(int)uVar8;
  uVar14 = uVar7 + uVar8;
  uVar1 = *(uint *)&(this->specs_).field_0x4;
  if ((uVar1 & 0xff) == 1) {
    uVar7 = (this->specs_).precision - uVar8;
    bVar16 = (byte)(uVar1 >> 0x1d) & 0 < (int)uVar7;
    uVar15 = 1;
    if ((long)uVar18 < 1) {
      uVar15 = uVar18;
    }
    uVar10 = 0;
    if (bVar16 != 0) {
      uVar10 = (ulong)uVar7;
    }
    cVar5 = write_exponent<wchar_t,duckdb_fmt::v6::internal::counting_iterator>
                      (uVar14 - 1,
                       (counting_iterator)
                       ((long)this->digits_ +
                       (ulong)(1 < (int)uVar8 | bVar16) +
                       uVar10 + ~(ulong)(this->digits_ + uVar15) + uVar18 + it.count_ + 3));
    return (counting_iterator)cVar5.count_;
  }
  if ((int)uVar7 < 0) {
    if ((int)uVar14 < 1) {
      uVar7 = -uVar14;
      if (uVar8 == 0) {
        uVar2 = (this->specs_).precision;
        uVar4 = uVar7;
        if (SBORROW4(uVar2,uVar7) != (int)(uVar2 + uVar14) < 0) {
          uVar4 = uVar2;
        }
        if (-1 < (int)uVar2) {
          uVar7 = uVar4;
        }
      }
      if (0 < (int)uVar8 && (uVar1 >> 0x1d & 1) == 0) {
        do {
          if (this->digits_[(ulong)uVar8 - 1] != '0') goto LAB_01eae1be;
          bVar3 = 1 < (int)uVar8;
          uVar8 = uVar8 - 1;
        } while (bVar3);
        uVar8 = 0;
      }
      if (uVar7 == 0 && uVar8 == 0) {
        sVar13 = it.count_ + 1;
      }
      else {
LAB_01eae1be:
        uVar18 = (ulong)(int)uVar8;
        sVar13 = ((it.count_ + (~((int)uVar7 >> 0x1f) & uVar7)) - ((long)uVar18 >> 0x3f & uVar18)) +
                 uVar18 + 2;
      }
    }
    else {
      uVar15 = (ulong)uVar14;
      if (uVar14 < 4 || (uVar1 & 0xff0000) == 0) {
        pcVar6 = this->digits_;
        it.count_ = it.count_ + uVar15;
      }
      else {
        iVar17 = 0;
        uVar10 = (ulong)uVar14 % 3;
        if ((int)uVar10 == 0) {
          uVar10 = 3;
        }
        pcVar6 = this->digits_;
        for (; iVar17 < (int)uVar14; iVar17 = iVar17 + iVar9) {
          iVar9 = (int)uVar10;
          it.count_ = it.count_ + (0 < iVar17) + uVar10;
          uVar10 = 3;
        }
      }
      if ((uVar1 >> 0x1d & 1) == 0) {
        if ((int)uVar14 <= (int)uVar8) {
          uVar8 = uVar14;
        }
        for (; (long)uVar15 < (long)uVar18; uVar18 = uVar18 - 1) {
          if (pcVar6[uVar18 - 1] != '0') {
            uVar8 = (uint)uVar18;
            break;
          }
        }
        uVar18 = (long)(int)uVar8 - uVar15;
        sVar13 = it.count_ + (long)(int)uVar8 + (ulong)(uVar8 != uVar14) +
                 (-uVar15 - ((long)uVar18 >> 0x3f & uVar18));
      }
      else {
        sVar13 = (((it.count_ - ((long)(uVar18 - uVar15) >> 0x3f & uVar18 - uVar15)) + uVar18) -
                 uVar15) + 1;
        iVar17 = (this->specs_).precision;
        uVar7 = iVar17 - uVar8;
        if (uVar7 != 0 && (int)uVar8 <= iVar17) {
          sVar13 = sVar13 + (~((int)uVar7 >> 0x1f) & uVar7);
        }
      }
    }
  }
  else {
    if ((int)uVar14 < 4 || (uVar1 & 0xff0000) == 0) {
      it.count_ = ((uVar7 + it.count_) - ((long)uVar18 >> 0x3f & uVar18)) + uVar18;
    }
    else {
      iVar17 = 0;
      uVar18 = (ulong)uVar14 % 3;
      if ((int)uVar18 == 0) {
        uVar18 = 3;
      }
      for (; iVar9 = (int)uVar18, iVar17 < (int)uVar14; iVar17 = iVar17 + iVar9) {
        lVar12 = it.count_ + (0 < iVar17);
        iVar11 = uVar8 - iVar17;
        if (iVar11 == 0 || (int)uVar8 < iVar17) {
          it.count_ = lVar12 + uVar18;
        }
        else {
          iVar19 = iVar11;
          if (iVar9 < iVar11) {
            iVar19 = iVar9;
          }
          uVar18 = (ulong)iVar19;
          it.count_ = (lVar12 - ((long)uVar18 >> 0x3f & uVar18)) + uVar18;
          if (iVar11 < iVar9) {
            it.count_ = it.count_ + (uint)(~(iVar9 - iVar19 >> 0x1f) & iVar9 - iVar19);
          }
        }
        uVar18 = 3;
      }
    }
    sVar13 = it.count_;
    if ((uVar1 >> 0x1d & 1) != 0) {
      iVar17 = (this->specs_).precision;
      uVar8 = iVar17 - uVar14;
      if (uVar8 == 0 || iVar17 < (int)uVar14) {
        sVar13 = it.count_ + 2;
        if ((uVar1 & 0xff) == 2) {
          sVar13 = it.count_ + 1;
        }
      }
      else {
        sVar13 = it.count_ + 1 + (ulong)uVar8;
      }
    }
  }
  return (counting_iterator)sVar13;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          if (i < num_digits_) {
            // we still need to write digits
            int write_count = std::min<int>(num_digits_ - i, digit_count);
            it = copy_str<Char>(digits_ + i, digits_ + i + write_count, it);
            if (write_count < digit_count) {
              // write any trailing zeros that belong to this batch
              it = std::fill_n(it, digit_count - write_count, static_cast<Char>('0'));
            }
          } else {
            // we only need to write trailing zeros
            it = std::fill_n(it, digit_count, static_cast<Char>('0'));
          }
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + num_digits_, it);
        it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      }
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          it = copy_str<Char>(digits_ + i, digits_ + i + digit_count, it);
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + full_exp, it);
      }
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (num_digits_ == 0 && specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }